

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

bool __thiscall smf::MidiFile::writeBase64(MidiFile *this,ostream *out,int width)

{
  uint uVar1;
  size_t in_RCX;
  void *__buf;
  MidiFile *this_00;
  ulong uVar2;
  string encoded;
  stringstream raw;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [8];
  MidiFile local_1a0 [3];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  write(this,(int)local_1a8,__buf,in_RCX);
  this_00 = local_1a0;
  std::__cxx11::stringbuf::str();
  base64Encode(&local_1f8,this_00,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1d8._M_dataplus._M_p._1_7_,(char)local_1d8._M_dataplus._M_p) !=
      &local_1d8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1d8._M_dataplus._M_p._1_7_,(char)local_1d8._M_dataplus._M_p));
  }
  if (width < 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  }
  else {
    uVar1 = (uint)local_1f8._M_string_length;
    if (0 < (int)uVar1) {
      uVar2 = 0;
      do {
        local_1d8._M_dataplus._M_p._0_1_ = local_1f8._M_dataplus._M_p[uVar2];
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_1d8,1);
        uVar2 = uVar2 + 1;
        if ((int)((uVar2 & 0xffffffff) % (ulong)(uint)width) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
        }
      } while ((uVar1 & 0x7fffffff) != uVar2);
    }
    if ((int)(uVar1 + 1) % width != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)&local_1a0[0].m_rwstatus);
  return true;
}

Assistant:

bool MidiFile::writeBase64(std::ostream& out, int width) {
	std::stringstream raw;
	bool status = MidiFile::write(raw);
	if (!status) {
		return status;
	}
	std::string encoded = MidiFile::base64Encode(raw.str());
	if (width <= 0) {
		out << encoded;
		return status;
	}
	int length = (int)encoded.size();
	for (int i=0; i<length; i++) {
		out << encoded[i];
		if ((i + 1) % width == 0) {
			out << "\n";
		}
	}
	if ((length + 1) % width != 0) {
		out << "\n";
	}
	return status;
}